

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

wchar_t count_known_monsters(void)

{
  bool bVar1;
  monster_race *pmVar2;
  monster_race *pmVar3;
  _Bool _Var4;
  uint uVar5;
  ulong uVar6;
  wchar_t wVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  long lVar12;
  
  if (z_info->r_max == 0) {
    wVar7 = L'\0';
  }
  else {
    uVar9 = 0;
    wVar7 = L'\0';
    do {
      pmVar3 = r_info;
      if (((l_list[uVar9].all_known != false) || (l_list[uVar9].sights != 0)) &&
         (r_info[uVar9].name != (char *)0x0)) {
        uVar5 = 1;
        if (L'\x01' < n_monster_group) {
          pmVar2 = r_info + uVar9;
          lVar12 = 0;
          bVar10 = 0;
          bVar11 = 0;
          do {
            if (monster_group[lVar12].n_inc_bases == L'\0') {
              bVar1 = false;
            }
            else {
              uVar6 = (ulong)monster_group[lVar12].n_inc_bases;
              bVar1 = 0 < (long)uVar6;
              if (0 < (long)uVar6) {
                uVar8 = 0;
                do {
                  if (pmVar3[uVar9].base == monster_group[lVar12].inc_bases[uVar8]) {
                    wVar7 = wVar7 + L'\x01';
                    bVar10 = 1;
                    bVar11 = 1;
                    bVar1 = true;
                    goto LAB_001d5d59;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar6 != uVar8);
                bVar1 = uVar8 < uVar6;
              }
            }
LAB_001d5d59:
            if (!bVar1) {
              _Var4 = flag_is_inter(pmVar2->flags,monster_group[lVar12].inc_flags,0xb);
              wVar7 = wVar7 + (uint)_Var4;
              bVar11 = bVar10;
              if (_Var4) {
                bVar10 = 1;
                bVar11 = 1;
              }
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < (long)n_monster_group + -1);
          uVar5 = (uint)(~bVar11 & 1);
        }
        wVar7 = wVar7 + uVar5;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < z_info->r_max);
  }
  return wVar7;
}

Assistant:

static int count_known_monsters(void)
{
	int m_count = 0, i;

	for (i = 0; i < z_info->r_max; ++i) {
		struct monster_race *race = &r_info[i];
		bool classified = false;
		int j;

		if (!l_list[i].all_known && !l_list[i].sights) {
			continue;
		}
		if (!race->name) continue;

		for (j = 0; j < n_monster_group - 1; ++j) {
			bool has_base = false;

			if (monster_group[j].n_inc_bases) {
				int k;

				for (k = 0; k < monster_group[j].n_inc_bases;
						++k) {
					if (race->base == monster_group[j].inc_bases[k]) {
						++m_count;
						has_base = true;
						classified = true;
						break;
					}
				}
			}
			if (!has_base && rf_is_inter(race->flags,
					monster_group[j].inc_flags)) {
				++m_count;
				classified = true;
			}
		}

		if (!classified) {
			++m_count;
		}
	}

	return m_count;
}